

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value *this;
  undefined8 uVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  allocator local_251;
  service srv;
  string local_248 [32];
  undefined1 local_228 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  undefined1 local_218 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  string captured;
  copy_filter flt;
  
  captured._M_dataplus._M_p = (pointer)&captured.field_2;
  captured._M_string_length = 0;
  captured.field_2._M_local_buf[0] = '\0';
  cppcms::service::service(&srv,argc,argv);
  this = (value *)cppcms::service::settings();
  _flt = _flt & 0xffffffffffffff00;
  write_tests = cppcms::json::value::get<bool>(this,"test.write",(bool *)&flt);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<async_test>();
  std::__cxx11::string::string(local_248,"/async",&local_251);
  cppcms::mount_point::mount_point((mount_point *)&flt,local_248);
  iVar4 = 1;
  cppcms::applications_pool::mount(uVar1,local_218,&flt,1);
  cppcms::mount_point::~mount_point((mount_point *)&flt);
  std::__cxx11::string::~string(local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<sync_test>();
  std::__cxx11::string::string(local_248,"/sync",&local_251);
  cppcms::mount_point::mount_point((mount_point *)&flt,local_248);
  cppcms::applications_pool::mount(uVar1,local_228,&flt,0);
  cppcms::mount_point::~mount_point((mount_point *)&flt);
  std::__cxx11::string::~string(local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220);
  _flt = (function *)&srv;
  cppcms::service::after_fork((function *)&srv);
  std::_Function_base::~_Function_base((_Function_base *)&flt);
  cppcms::copy_filter::copy_filter(&flt,(ostream *)&std::cerr);
  cppcms::service::run();
  cppcms::copy_filter::detach_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&captured,local_248);
  std::__cxx11::string::~string(local_248);
  cppcms::copy_filter::~copy_filter(&flt);
  cppcms::service::~service(&srv);
  while (lVar2 = std::__cxx11::string::find((char *)&captured,0x10a09e), lVar2 != -1) {
    count_timeouts = count_timeouts + 1;
  }
  if (write_tests == true) {
    if (((async_bad_count != 2) ||
        (((sync_bad_count != 2 || (count_timeouts != 4)) || (above_3to != 2)))) || (below_2to != 2))
    goto LAB_00108900;
LAB_001088cc:
    print_count_report((ostream *)&std::cout);
    if (run_ok != false) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
      iVar4 = 0;
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00108930;
    }
    pcVar5 = "Python script failed";
  }
  else {
    if ((eof_detected == true) && (count_timeouts == 5)) goto LAB_001088cc;
LAB_00108900:
    print_count_report((ostream *)&std::cerr);
    pcVar5 = "Failed";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00108930:
  std::__cxx11::string::~string((string *)&captured);
  return iVar4;
}

Assistant:

int main(int argc,char **argv)
{
	std::string captured;
	try {
		cppcms::service srv(argc,argv);
		write_tests = srv.settings().get("test.write",false);
		srv.applications_pool().mount( 	cppcms::create_pool<async_test>(),
						cppcms::mount_point("/async"),
						cppcms::app::asynchronous);
		srv.applications_pool().mount( cppcms::create_pool<sync_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		cppcms::copy_filter flt(std::cerr); // record the log
		srv.run();
		captured = flt.detach(); // get the log
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	size_t pos = 0;
	while((pos=captured.find("Timeout on connection",pos))!=std::string::npos) {
		pos+=10;
		count_timeouts++;
	}
	if(
		write_tests ?
		(
			async_bad_count != 2 
			|| sync_bad_count != 2 
			|| count_timeouts != 4
			|| above_3to != 2
			|| below_2to != 2
		)
		:
		(
			!eof_detected 
			|| count_timeouts != 5
		)
	  ) 
	{
		print_count_report(std::cerr);
		std::cerr << "Failed" << std::endl;
		return EXIT_FAILURE;
	}
	print_count_report(std::cout);
	if(!run_ok ) {
		std::cerr << "Python script failed" << std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}